

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void * __thiscall
c4::MemoryResourceLinear::do_allocate
          (MemoryResourceLinear *this,size_t sz,size_t alignment,void *hint)

{
  bool bVar1;
  error_flags eVar2;
  void *pvVar3;
  size_t in_RDX;
  size_t in_RSI;
  long in_RDI;
  size_t space;
  void *mem;
  ulong local_48;
  void *local_40;
  char *local_38;
  undefined4 local_30;
  size_t local_18;
  void *local_8;
  
  if (in_RSI == 0) {
    local_8 = (void *)0x0;
  }
  else if (*(ulong *)(in_RDI + 0x20) < *(long *)(in_RDI + 0x28) + in_RSI) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x445a;
    handle_error(0x3fa1ef,(char *)0x445a,"out of memory");
    local_8 = (void *)0x0;
  }
  else {
    local_40 = (void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x28));
    local_48 = *(long *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x28);
    local_18 = in_RSI;
    pvVar3 = std::align(in_RDX,in_RSI,&local_40,&local_48);
    if (pvVar3 == (void *)0x0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x4469,"could not align memory");
      local_40 = (void *)0x0;
    }
    else {
      if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x28)) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        handle_error(0x3fa1ef,(char *)0x4461,"check failed: %s","m_pos <= m_size");
      }
      if ((ulong)(*(long *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x28)) < local_48) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        handle_error(0x3fa1ef,(char *)0x4462,"check failed: %s","m_size - m_pos >= space");
      }
      *(ulong *)(in_RDI + 0x28) =
           ((*(long *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x28)) - local_48) +
           *(long *)(in_RDI + 0x28);
      *(size_t *)(in_RDI + 0x28) = local_18 + *(long *)(in_RDI + 0x28);
      if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x28)) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        handle_error(0x3fa1ef,(char *)0x4465,"check failed: %s","m_pos <= m_size");
      }
    }
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

void* MemoryResourceLinear::do_allocate(size_t sz, size_t alignment, void *hint)
{
    C4_UNUSED(hint);
    if(sz == 0) return nullptr;
    // make sure there's enough room to allocate
    if(m_pos + sz > m_size)
    {
        C4_ERROR("out of memory");
        return nullptr;
    }
    void *mem = m_mem + m_pos;
    size_t space = m_size - m_pos;
    if(std::align(alignment, sz, mem, space))
    {
        C4_ASSERT(m_pos <= m_size);
        C4_ASSERT(m_size - m_pos >= space);
        m_pos += (m_size - m_pos) - space;
        m_pos += sz;
        C4_ASSERT(m_pos <= m_size);
    }
    else
    {
        C4_ERROR("could not align memory");
        mem = nullptr;
    }
    return mem;
}